

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_divmod_into(mp_int *n,mp_int *d,mp_int *q_out,mp_int *r_out)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  mp_int *r;
  mp_int *r_00;
  mp_int *pmVar7;
  mp_int *pmVar8;
  mp_int *pmVar9;
  mp_int *x;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  BignumInt BVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  mp_int product_shifted;
  mp_int quotient_alias;
  mp_int local_50;
  mp_int local_40;
  
  uVar12 = d->nw;
  uVar5 = 0;
  uVar14 = 0;
  do {
    if (uVar14 < uVar12) {
      BVar15 = d->w[uVar14];
    }
    else {
      BVar15 = 0;
    }
    uVar5 = uVar5 | BVar15;
    uVar14 = uVar14 + 1;
  } while (uVar12 + (uVar12 == 0) != uVar14);
  if ((uVar5 & 1) == 0 && uVar5 >> 1 == 0) {
    __assert_fail("!mp_eq_integer(d, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x7fc,"void mp_divmod_into(mp_int *, mp_int *, mp_int *, mp_int *)");
  }
  if (uVar12 == 0) {
    lVar16 = 0;
    uVar5 = 0;
    uVar14 = 0;
  }
  else {
    uVar18 = 0;
    uVar5 = 0;
    uVar14 = 0;
    uVar10 = 0;
    uVar13 = 0;
    do {
      uVar1 = d->w[uVar10];
      if ((uVar1 & 1) != 0 || uVar1 >> 1 != 0) {
        uVar18 = uVar10;
        uVar5 = uVar1;
        uVar14 = uVar13;
      }
      uVar10 = uVar10 + 1;
      uVar13 = uVar1;
    } while (uVar12 != uVar10);
    lVar16 = uVar18 << 6;
  }
  lVar6 = 5;
  uVar13 = 0;
  do {
    lVar11 = 1L << ((byte)lVar6 & 0x3f);
    bVar2 = (byte)lVar11;
    uVar10 = uVar5 >> (-bVar2 & 0x3f);
    bVar2 = bVar2 & 0x3f;
    uVar18 = uVar5 << bVar2 | uVar14 >> 0x40 - bVar2;
    if ((uVar10 & 1) != 0 || uVar10 >> 1 != 0) {
      lVar11 = 0;
      uVar18 = uVar5;
    }
    uVar5 = uVar18;
    uVar14 = uVar14 << ((byte)lVar11 & 0x3f);
    uVar13 = uVar13 + lVar11;
    bVar20 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar20);
  uVar5 = uVar5 >> 0x20;
  uVar18 = ((0x90d876cd -
            ((0xecf97a41 -
             ((0xf75cd403 -
              ((0xaada0bb8 -
               ((0x9c2da00e -
                ((0xb63721e8 - ((0xf63e71ea - (uVar5 * 0x92db03d6 >> 0x22)) * uVar5 >> 0x22)) *
                 uVar5 >> 0x21)) * uVar5 >> 0x20)) * uVar5 >> 0x1f)) * uVar5 >> 0x1f)) * uVar5 >>
            0x1f)) * uVar5 & 0xfffffffffc000000) * -0x40 + 0x682799a000000000;
  uVar5 = 5;
  uVar14 = 0;
  do {
    bVar3 = (byte)(1L << ((byte)uVar5 & 0x3f));
    bVar2 = bVar3 & 0x3f;
    uVar10 = -(ulong)((uVar13 >> (uVar5 & 0x3f) & 1) != 0);
    uVar14 = ((uVar14 << bVar2 | uVar18 >> 0x40 - bVar2) ^ uVar14) & uVar10 ^ uVar14;
    uVar18 = (uVar18 << (bVar3 & 0x3f) ^ uVar18) & uVar10 ^ uVar18;
    bVar20 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar20);
  uVar12 = (uVar12 + n->nw) * 0x40 | 3;
  lVar6 = 0;
  if (0xbe < uVar12) {
    lVar6 = uVar12 - 0xbf;
  }
  uVar5 = lVar6 + 0x13fU >> 6;
  r = mp_make_sized(uVar5);
  uVar12 = (lVar6 - lVar16) + 0x7fU >> 6;
  mp_add_integer_into_shifted_by_words(r,r,uVar18,uVar12);
  mp_add_integer_into_shifted_by_words(r,r,uVar14,uVar12 + 1);
  r_00 = mp_make_sized(uVar5);
  mp_add_integer_into_shifted_by_words(r_00,r_00,1,lVar6 + 0xffU >> 6);
  pmVar7 = mp_make_sized(d->nw + uVar5);
  uVar12 = pmVar7->nw;
  if (pmVar7->nw < uVar5) {
    uVar12 = uVar5;
  }
  pmVar8 = mp_make_sized(uVar12);
  pmVar9 = mp_make_sized(uVar5 + pmVar8->nw);
  uVar12 = r->nw;
  uVar5 = d->nw;
  if (d->nw < uVar12) {
    uVar5 = uVar12;
  }
  if (pmVar7->nw < uVar5) {
    uVar5 = pmVar7->nw;
  }
  uVar14 = pmVar8->nw;
  if (pmVar8->nw < uVar12) {
    uVar14 = uVar12;
  }
  if (pmVar9->nw < uVar14) {
    uVar14 = pmVar9->nw;
  }
  uVar12 = uVar14 * 6;
  if (uVar14 * 6 < uVar5 * 6) {
    uVar12 = uVar5 * 6;
  }
  x = mp_make_sized(uVar12);
  uVar14 = (lVar6 + 0x3fU & 0xffffffffffffffc0) + 0xbf >> 6;
  uVar12 = pmVar9->nw;
  uVar5 = uVar14;
  if (uVar12 < uVar14) {
    uVar5 = uVar12;
  }
  local_50.nw = uVar12 - uVar5;
  if (uVar12 <= uVar12 - uVar5) {
    local_50.nw = uVar12;
  }
  local_50.w = pmVar9->w + uVar5;
  uVar12 = n->nw << 6 | 4;
  if (0x14 < uVar12) {
    uVar5 = 0x14;
    do {
      mp_mul_internal(pmVar7,r,d,*x);
      mp_add_masked_into(pmVar8->w,pmVar8->nw,r_00,pmVar7,0xffffffffffffffff,0xffffffffffffffff,1);
      mp_mul_internal(pmVar9,r,pmVar8,*x);
      mp_rshift_fixed_into(r,&local_50,0x3f);
      uVar5 = uVar5 * 2 - 1;
    } while (uVar5 < uVar12);
  }
  mp_free(pmVar7);
  mp_free(pmVar8);
  mp_free(pmVar9);
  mp_free(x);
  pmVar7 = mp_make_sized(n->nw + r->nw);
  mp_mul_into(pmVar7,r,n);
  uVar12 = pmVar7->nw;
  if (uVar12 < uVar14) {
    uVar14 = uVar12;
  }
  local_40.nw = uVar12 - uVar14;
  if (uVar12 <= uVar12 - uVar14) {
    local_40.nw = uVar12;
  }
  local_40.w = pmVar7->w + uVar14;
  pmVar8 = mp_make_sized(n->nw);
  mp_rshift_fixed_into(pmVar8,&local_40,0x3f);
  pmVar9 = mp_make_sized(d->nw);
  mp_mul_into(pmVar9,pmVar8,d);
  mp_add_masked_into(pmVar9->w,pmVar9->nw,n,pmVar9,0xffffffffffffffff,0xffffffffffffffff,1);
  iVar19 = 1;
  uVar17 = 0;
  do {
    uVar4 = mp_cmp_hs(pmVar9,d);
    BVar15 = -(ulong)uVar4;
    mp_add_masked_into(pmVar9->w,pmVar9->nw,pmVar9,d,BVar15,BVar15,(ulong)((uint)BVar15 & 1));
    uVar17 = uVar17 + uVar4;
    iVar19 = iVar19 + -1;
  } while (iVar19 == 0);
  mp_add_integer_into(pmVar8,pmVar8,(ulong)uVar17);
  uVar17 = mp_cmp_hs(pmVar9,d);
  if (uVar17 != 0) {
    __assert_fail("!mp_cmp_hs(remainder, d)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x90d,"void mp_divmod_into(mp_int *, mp_int *, mp_int *, mp_int *)");
  }
  if (q_out != (mp_int *)0x0) {
    uVar12 = pmVar8->nw;
    if (q_out->nw < pmVar8->nw) {
      uVar12 = q_out->nw;
    }
    memmove(q_out->w,pmVar8->w,uVar12 * 8);
    smemclr(q_out->w + uVar12,(q_out->nw - uVar12) * 8);
  }
  if (r_out != (mp_int *)0x0) {
    uVar12 = pmVar9->nw;
    if (r_out->nw < pmVar9->nw) {
      uVar12 = r_out->nw;
    }
    memmove(r_out->w,pmVar9->w,uVar12 * 8);
    smemclr(r_out->w + uVar12,(r_out->nw - uVar12) * 8);
  }
  mp_free(r);
  mp_free(r_00);
  mp_free(pmVar7);
  mp_free(pmVar8);
  mp_free(pmVar9);
  return;
}

Assistant:

void mp_divmod_into(mp_int *n, mp_int *d, mp_int *q_out, mp_int *r_out)
{
    assert(!mp_eq_integer(d, 0));

    /*
     * We do division by using Newton-Raphson iteration to converge to
     * the reciprocal of d (or rather, R/d for R a sufficiently large
     * power of 2); then we multiply that reciprocal by n; and we
     * finish up with conditional subtraction.
     *
     * But we have to do it in a fixed number of N-R iterations, so we
     * need some error analysis to know how many we might need.
     *
     * The iteration is derived by defining f(r) = d - R/r.
     * Differentiating gives f'(r) = R/r^2, and the Newton-Raphson
     * formula applied to those functions gives
     *
     *      r_{i+1} = r_i - f(r_i) / f'(r_i)
     *              = r_i - (d - R/r_i) r_i^2 / R
     *              = r_i (2 R - d r_i) / R
     *
     * Now let e_i be the error in a given iteration, in the sense
     * that
     *
     *        d r_i = R + e_i
     *  i.e.  e_i/R = (r_i - r_true) / r_true
     *
     * so e_i is the _relative_ error in r_i.
     *
     * We must also introduce a rounding-error term, because the
     * division by R always gives an integer. This might make the
     * output off by up to 1 (in the negative direction, because
     * right-shifting gives floor of the true quotient). So when we
     * divide by R, we must imagine adding some f in [0,1). Then we
     * have
     *
     *    d r_{i+1} = d r_i (2 R - d r_i) / R - d f
     *              = (R + e_i) (R - e_i) / R - d f
     *              = (R^2 - e_i^2) / R - d f
     *              = R - (e_i^2 / R + d f)
     * =>   e_{i+1} = - (e_i^2 / R + d f)
     *
     * The sum of two positive quantities is bounded above by twice
     * their max, and max |f| = 1, so we can bound this as follows:
     *
     *               |e_{i+1}| <= 2 max (e_i^2/R, d)
     *             |e_{i+1}/R| <= 2 max ((e_i/R)^2, d/R)
     *        log2 |R/e_{i+1}| <= min (2 log2 |R/e_i|, log2 |R/d|) - 1
     *
     * which tells us that the number of 'good' bits - i.e.
     * log2(R/e_i) - very nearly doubles at every iteration (apart
     * from that subtraction of 1), until it gets to the same size as
     * log2(R/d). In other words, the size of R in bits has to be the
     * size of denominator we're putting in, _plus_ the amount of
     * precision we want to get back out.
     *
     * So when we multiply n (the input numerator) by our final
     * reciprocal approximation r, but actually r differs from R/d by
     * up to 2, then it follows that
     *
     *   n/d - nr/R = n/d - [ n (R/d + e) ] / R
     *              = n/d - [ (n/d) R + n e ] / R
     *              = -ne/R
     *      =>   0 <= n/d - nr/R < 2n/R
     *
     * so our computed quotient can differ from the true n/d by up to
     * 2n/R. Hence, as long as we also choose R large enough that 2n/R
     * is bounded above by a constant, we can guarantee a bounded
     * number of final conditional-subtraction steps.
     */

    /*
     * Get at least 32 of the most significant bits of the input
     * number.
     */
    size_t hiword_index = 0;
    uint64_t hibits = 0, lobits = 0;
    mp_find_highest_nonzero_word_pair(d, 64 - BIGNUM_INT_BITS,
                                      &hiword_index, &hibits, &lobits);

    /*
     * Make a shifted combination of those two words which puts the
     * topmost bit of the number at bit 63.
     */
    size_t shift_up = 0;
    for (size_t i = BIGNUM_INT_BITS_BITS; i-- > 0;) {
        size_t sl = (size_t)1 << i;       /* left shift count */
        size_t sr = 64 - sl;     /* complementary right-shift count */

        /* Should we shift up? */
        unsigned indicator = 1 ^ normalise_to_1_u64(hibits >> sr);

        /* If we do, what will we get? */
        uint64_t new_hibits = (hibits << sl) | (lobits >> sr);
        uint64_t new_lobits = lobits << sl;
        size_t new_shift_up = shift_up + sl;

        /* Conditionally swap those values in. */
        hibits    ^= (hibits    ^ new_hibits   ) & -(uint64_t)indicator;
        lobits    ^= (lobits    ^ new_lobits   ) & -(uint64_t)indicator;
        shift_up  ^= (shift_up  ^ new_shift_up ) & -(size_t)  indicator;
    }

    /*
     * So now we know the most significant 32 bits of d are at the top
     * of hibits. Approximate the reciprocal of those bits.
     */
    lobits = (uint64_t)recip_approx_32(hibits >> 32) << 32;
    hibits = 0;

    /*
     * And shift that up by as many bits as the input was shifted up
     * just now, so that the product of this approximation and the
     * actual input will be close to a fixed power of two regardless
     * of where the MSB was.
     *
     * I do this in another log n individual passes, partly in case
     * the CPU's register-controlled shift operation isn't
     * time-constant, and also in case the compiler code-generates
     * uint64_t shifts out of a variable number of smaller-word shift
     * instructions, e.g. by splitting up into cases.
     */
    for (size_t i = BIGNUM_INT_BITS_BITS; i-- > 0;) {
        size_t sl = (size_t)1 << i;       /* left shift count */
        size_t sr = 64 - sl;     /* complementary right-shift count */

        /* Should we shift up? */
        unsigned indicator = 1 & (shift_up >> i);

        /* If we do, what will we get? */
        uint64_t new_hibits = (hibits << sl) | (lobits >> sr);
        uint64_t new_lobits = lobits << sl;

        /* Conditionally swap those values in. */
        hibits    ^= (hibits    ^ new_hibits   ) & -(uint64_t)indicator;
        lobits    ^= (lobits    ^ new_lobits   ) & -(uint64_t)indicator;
    }

    /*
     * The product of the 128-bit value now in hibits:lobits with the
     * 128-bit value we originally retrieved in the same variables
     * will be in the vicinity of 2^191. So we'll take log2(R) to be
     * 191, plus a multiple of BIGNUM_INT_BITS large enough to allow R
     * to hold the combined sizes of n and d.
     */
    size_t log2_R;
    {
        size_t max_log2_n = (n->nw + d->nw) * BIGNUM_INT_BITS;
        log2_R = max_log2_n + 3;
        log2_R -= size_t_min(191, log2_R);
        log2_R = (log2_R + BIGNUM_INT_BITS - 1) & ~(BIGNUM_INT_BITS - 1);
        log2_R += 191;
    }

    /* Number of words in a bignum capable of holding numbers the size
     * of twice R. */
    size_t rw = ((log2_R+2) + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;

    /*
     * Now construct our full-sized starting reciprocal approximation.
     */
    mp_int *r_approx = mp_make_sized(rw);
    size_t output_bit_index;
    {
        /* Where in the input number did the input 128-bit value come from? */
        size_t input_bit_index =
            (hiword_index * BIGNUM_INT_BITS) - (128 - BIGNUM_INT_BITS);

        /* So how far do we need to shift our 64-bit output, if the
         * product of those two fixed-size values is 2^191 and we want
         * to make it 2^log2_R instead? */
        output_bit_index = log2_R - 191 - input_bit_index;

        /* If we've done all that right, it should be a whole number
         * of words. */
        assert(output_bit_index % BIGNUM_INT_BITS == 0);
        size_t output_word_index = output_bit_index / BIGNUM_INT_BITS;

        mp_add_integer_into_shifted_by_words(
            r_approx, r_approx, lobits, output_word_index);
        mp_add_integer_into_shifted_by_words(
            r_approx, r_approx, hibits,
            output_word_index + 64 / BIGNUM_INT_BITS);
    }

    /*
     * Make the constant 2*R, which we'll need in the iteration.
     */
    mp_int *two_R = mp_make_sized(rw);
    BignumInt top_word = (BignumInt)1 << ((log2_R+1) % BIGNUM_INT_BITS);
    mp_add_integer_into_shifted_by_words(
        two_R, two_R, top_word, (log2_R+1) / BIGNUM_INT_BITS);

    /*
     * Scratch space.
     */
    mp_int *dr = mp_make_sized(rw + d->nw);
    mp_int *diff = mp_make_sized(size_t_max(rw, dr->nw));
    mp_int *product = mp_make_sized(rw + diff->nw);
    size_t scratchsize = size_t_max(
        mp_mul_scratchspace(dr->nw, r_approx->nw, d->nw),
        mp_mul_scratchspace(product->nw, r_approx->nw, diff->nw));
    mp_int *scratch = mp_make_sized(scratchsize);
    mp_int product_shifted = mp_make_alias(
        product, log2_R / BIGNUM_INT_BITS, product->nw);

    /*
     * Initial error estimate: the 32-bit output of recip_approx_32
     * differs by less than 2048 (== 2^11) from the true top 32 bits
     * of the reciprocal, so the relative error is at most 2^11
     * divided by the 32-bit reciprocal, which at worst is 2^11/2^31 =
     * 2^-20. So even in the worst case, we have 20 good bits of
     * reciprocal to start with.
     */
    size_t good_bits = 31 - 11;
    size_t good_bits_needed = BIGNUM_INT_BITS * n->nw + 4; /* add a few */

    /*
     * Now do Newton-Raphson iterations until we have reason to think
     * they're not converging any more.
     */
    while (good_bits < good_bits_needed) {
        /*
         * Compute the next iterate.
         */
        mp_mul_internal(dr, r_approx, d, *scratch);
        mp_sub_into(diff, two_R, dr);
        mp_mul_internal(product, r_approx, diff, *scratch);
        mp_rshift_fixed_into(r_approx, &product_shifted,
                             log2_R % BIGNUM_INT_BITS);

        /*
         * Adjust the error estimate.
         */
        good_bits = good_bits * 2 - 1;
    }

    mp_free(dr);
    mp_free(diff);
    mp_free(product);
    mp_free(scratch);

    /*
     * Now we've got our reciprocal, we can compute the quotient, by
     * multiplying in n and then shifting down by log2_R bits.
     */
    mp_int *quotient_full = mp_mul(r_approx, n);
    mp_int quotient_alias = mp_make_alias(
        quotient_full, log2_R / BIGNUM_INT_BITS, quotient_full->nw);
    mp_int *quotient = mp_make_sized(n->nw);
    mp_rshift_fixed_into(quotient, &quotient_alias, log2_R % BIGNUM_INT_BITS);

    /*
     * Next, compute the remainder.
     */
    mp_int *remainder = mp_make_sized(d->nw);
    mp_mul_into(remainder, quotient, d);
    mp_sub_into(remainder, n, remainder);

    /*
     * Finally, two conditional subtractions to fix up any remaining
     * rounding error. (I _think_ one should be enough, but this
     * routine isn't time-critical enough to take chances.)
     */
    unsigned q_correction = 0;
    for (unsigned iter = 0; iter < 2; iter++) {
        unsigned need_correction = mp_cmp_hs(remainder, d);
        mp_cond_sub_into(remainder, remainder, d, need_correction);
        q_correction += need_correction;
    }
    mp_add_integer_into(quotient, quotient, q_correction);

    /*
     * Now we should have a perfect answer, i.e. 0 <= r < d.
     */
    assert(!mp_cmp_hs(remainder, d));

    if (q_out)
        mp_copy_into(q_out, quotient);
    if (r_out)
        mp_copy_into(r_out, remainder);

    mp_free(r_approx);
    mp_free(two_R);
    mp_free(quotient_full);
    mp_free(quotient);
    mp_free(remainder);
}